

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChExtruderBeamEuler::ChExtruderBeamEuler
          (ChExtruderBeamEuler *this,ChSystem *msystem,shared_ptr<chrono::fea::ChMesh> *mmesh,
          shared_ptr<chrono::fea::ChBeamSectionEuler> *sect,double mh,ChCoordsys<double> *moutlet,
          double mspeed)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  ChCoordsys<double> *mc;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  double dVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ChSystem *pCVar3;
  ChMesh *this_02;
  element_type *peVar4;
  element_type *peVar5;
  ChLinkMotorLinearSpeed *this_03;
  element_type *peVar6;
  _func_int **pp_Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ChBody *this_04;
  ChNodeFEAxyzrot *this_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  ChCoordsys<double> *size;
  undefined1 auVar8 [32];
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> nodeA;
  ChVector<double> v;
  value_type local_378;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  *local_368;
  ChBodyFrame *local_360;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_358;
  undefined1 *local_350;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_348;
  shared_ptr<chrono::ChPhysicsItem> local_340;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_330;
  shared_ptr<chrono::ChPhysicsItem> local_320;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_310;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_308;
  double local_300;
  shared_ptr<chrono::ChFunction> local_2f8;
  ChFrame<double> local_2e8;
  ChFrame<double> local_258;
  ChFrame<double> local_1c8;
  ChFrame<double> local_140;
  ChFrame<double> local_b8;
  
  mc = &this->outlet;
  (this->outlet).pos.m_data[0] = 0.0;
  (this->outlet).pos.m_data[1] = 0.0;
  (this->outlet).pos.m_data[2] = 0.0;
  (this->beam_elems).
  super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamEuler>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamEuler>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->beam_elems).
  super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamEuler>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamEuler>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->beam_elems).
  super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamEuler>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamEuler>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->beam_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->beam_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->beam_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->beam_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->beam_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->actuator).super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->actuator).super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->guide).super___shared_ptr<chrono::ChLinkMateGeneric,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->guide).super___shared_ptr<chrono::ChLinkMateGeneric,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  auVar8 = ZEXT432(0) << 0x40;
  this->mesh = (shared_ptr<chrono::fea::ChMesh>)auVar8._0_16_;
  this->beam_section = (shared_ptr<chrono::fea::ChBeamSectionEuler>)auVar8._16_16_;
  (this->outlet).rot.m_data[0] = 1.0;
  (this->outlet).rot.m_data[1] = 0.0;
  (this->outlet).rot.m_data[2] = 0.0;
  (this->outlet).rot.m_data[3] = 0.0;
  this->contact_material = (shared_ptr<chrono::ChMaterialSurfaceSMC>)auVar8._0_16_;
  this->contactcloud = (shared_ptr<chrono::fea::ChContactSurfaceNodeCloud>)auVar8._16_16_;
  this->h = mh;
  if (mc != moutlet) {
    (this->outlet).pos.m_data[0] = (moutlet->pos).m_data[0];
    (this->outlet).pos.m_data[1] = (moutlet->pos).m_data[1];
    (this->outlet).pos.m_data[2] = (moutlet->pos).m_data[2];
    (this->outlet).rot.m_data[0] = (moutlet->rot).m_data[0];
    (this->outlet).rot.m_data[1] = (moutlet->rot).m_data[1];
    (this->outlet).rot.m_data[2] = (moutlet->rot).m_data[2];
    (this->outlet).rot.m_data[3] = (moutlet->rot).m_data[3];
  }
  local_368 = &this->beam_nodes;
  this->mysystem = msystem;
  (this->mesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mmesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = &(this->mesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  local_300 = mspeed;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (this_00,&(mmesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount);
  (this->beam_section).
  super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (sect->super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  this_01 = &(this->beam_section).
             super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  __r = &(sect->super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(this_01,__r);
  this->mytime = 0.0;
  this->speed = local_300;
  local_310 = this_01;
  local_308 = this_00;
  this_04 = (ChBody *)ChFrame<double>::operator_new((ChFrame<double> *)0x360,(size_t)__r);
  ChBody::ChBody(this_04,BULLET);
  local_2e8._vptr_ChFrame = (_func_int **)this_04;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBody*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2e8.coord,this_04);
  dVar1 = local_2e8.coord.pos.m_data[0];
  pp_Var7 = local_2e8._vptr_ChFrame;
  local_2e8._vptr_ChFrame = (_func_int **)0x0;
  local_2e8.coord.pos.m_data[0] = 0.0;
  p_Var2 = (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pp_Var7;
  (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar1;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8.coord.pos.m_data[0] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8.coord.pos.m_data[0]);
  }
  ChBody::SetBodyFixed
            ((this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             true);
  local_320.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_ChPhysicsItem;
  pCVar3 = this->mysystem;
  local_320.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
  if (local_320.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_320.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_320.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_320.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_320.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ChSystem::Add(pCVar3,&local_320);
  if (local_320.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_320.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  size = mc;
  ChFrame<double>::ChFrame(&local_258,mc);
  this_05 = (ChNodeFEAxyzrot *)ChFrame<double>::operator_new((ChFrame<double> *)0x2c8,(size_t)size);
  local_2e8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  local_2e8.coord.pos.m_data[0] = local_258.coord.pos.m_data[0];
  local_2e8.coord.pos.m_data[1] = local_258.coord.pos.m_data[1];
  local_2e8.coord.pos.m_data[2] = local_258.coord.pos.m_data[2];
  local_2e8.coord.rot.m_data[0] = local_258.coord.rot.m_data[0];
  local_2e8.coord.rot.m_data[1] = local_258.coord.rot.m_data[1];
  local_2e8.coord.rot.m_data[2] = local_258.coord.rot.m_data[2];
  local_2e8.coord.rot.m_data[3] = local_258.coord.rot.m_data[3];
  local_2e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_2e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_2e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_2e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_2e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_2e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_2e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_2e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_2e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  ChNodeFEAxyzrot::ChNodeFEAxyzrot(this_05,&local_2e8);
  local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this_05;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::fea::ChNodeFEAxyzrot*>
            (&local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,this_05);
  peVar6 = local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_258.coord.pos.m_data[1] = this->speed;
  local_258._vptr_ChFrame = (_func_int **)(local_258.coord.pos.m_data[1] * VECT_X);
  local_258.coord.pos.m_data[0] = local_258.coord.pos.m_data[1] * DAT_00b90ad8;
  local_258.coord.pos.m_data[1] = local_258.coord.pos.m_data[1] * DAT_00b90ae0;
  ChCoordsys<double>::TransformDirectionLocalToParent(mc,(ChVector<double> *)&local_258);
  (**(code **)(*(long *)&(peVar6->super_ChNodeFEAbase).field_0x18 + 0x38))
            (&(peVar6->super_ChNodeFEAbase).field_0x18,&local_2e8);
  peVar6 = local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_2e8._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_2e8.coord.pos.m_data[0] = 0.0;
  local_2e8.coord.pos.m_data[1] = 0.0;
  local_2e8.coord.pos.m_data[2] = 0.0;
  local_b8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  local_b8.coord.pos.m_data[0] = 0.0;
  local_b8.coord.pos.m_data[1] = 0.0;
  local_b8.coord.pos.m_data[2] = 0.0;
  local_b8.coord.rot.m_data[0] = 1.0;
  local_b8.coord.rot.m_data[1] = 0.0;
  local_b8.coord.rot.m_data[2] = 0.0;
  local_b8.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_b8.Amatrix,(ChQuaternion<double> *)&local_2e8);
  ChFrame<double>::operator=(&peVar6->X0,&local_b8);
  this_02 = (this->mesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_330.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &(local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->super_ChNodeFEAbase;
  local_330.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ChMesh::AddNode(this_02,&local_330);
  if (local_330.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::push_back(local_368,&local_378);
  local_2e8._vptr_ChFrame = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChLinkMotorLinearSpeed,std::allocator<chrono::ChLinkMotorLinearSpeed>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2e8.coord,
             (ChLinkMotorLinearSpeed **)&local_2e8,
             (allocator<chrono::ChLinkMotorLinearSpeed> *)&local_258);
  dVar1 = local_2e8.coord.pos.m_data[0];
  pp_Var7 = local_2e8._vptr_ChFrame;
  local_2e8._vptr_ChFrame = (_func_int **)0x0;
  local_2e8.coord.pos.m_data[0] = 0.0;
  p_Var2 = (this->actuator).
           super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->actuator).super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pp_Var7;
  (this->actuator).super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar1;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8.coord.pos.m_data[0] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8.coord.pos.m_data[0]);
  }
  local_340.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (this->actuator).
       super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pCVar3 = this->mysystem;
  local_340.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (this->actuator).
         super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
  if (local_340.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_340.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_340.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_340.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_340.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ChSystem::Add(pCVar3,&local_340);
  if (local_340.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_340.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  peVar4 = (this->actuator).
           super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_350 = &((local_378.
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->super_ChNodeFEAbase).field_0x18;
  if (local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (ChNodeFEAxyzrot *)0x0) {
    local_350 = (undefined1 *)0x0;
  }
  local_348 = local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
  if (local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  peVar5 = (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_360 = &peVar5->super_ChBodyFrame;
  if (peVar5 == (element_type *)0x0) {
    local_360 = (ChBodyFrame *)0x0;
  }
  local_358 = (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (local_358 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_358->_M_use_count = local_358->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_358->_M_use_count = local_358->_M_use_count + 1;
    }
  }
  ChFrame<double>::ChFrame(&local_140,mc);
  ChFrame<double>::ChFrame(&local_1c8,mc);
  (**(code **)(*(long *)&(peVar4->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric
                         .super_ChLinkMate.super_ChLink + 0x248))
            (peVar4,&local_350,&local_360,0,&local_140,&local_1c8);
  if (local_358 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358);
  }
  if (local_348 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_348);
  }
  this_03 = (this->actuator).
            super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  (local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  dVar1 = this->speed;
  local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  *(double *)
   &local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._M_use_count = dVar1;
  ChLinkMotorLinearSpeed::SetSpeedFunction(this_03,&local_2f8);
  if (local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  *(double *)
   &(((this->actuator).
      super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChLinkMotorLinear).field_0x278 = this->h;
  if (local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_378.
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

ChExtruderBeamEuler::ChExtruderBeamEuler(
    ChSystem* msystem,                            // system to store the constraints
    std::shared_ptr<ChMesh> mmesh,                // mesh to store the resulting elements
    std::shared_ptr<ChBeamSectionEuler> sect,     // section material for beam elements
    double mh,                                    // element length
    const ChCoordsys<> moutlet,                   // outlet pos & orientation (x is extrusion direction)
    double mspeed                                 // speed
) {
    h = mh;
    outlet = moutlet;
    mysystem = msystem;
    mesh = mmesh;
    beam_section = sect;
    mytime = 0;
    speed = mspeed;

    ground = chrono_types::make_shared<ChBody>();
    ground->SetBodyFixed(true);
    mysystem->Add(ground);

    auto nodeA = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(outlet));
    nodeA->SetPos_dt(outlet.TransformDirectionLocalToParent(VECT_X * this->speed));
    nodeA->SetX0(ChFrame<>());
    mesh->AddNode(nodeA);
    beam_nodes.push_back(nodeA);

    /*
        actuator = chrono_types::make_shared<ChLinkMotorLinearPosition>();
        mysystem->Add(actuator);
        actuator->Initialize(nodeA, ground, false, ChFrame<>(outlet), ChFrame<>(outlet));
        actuator->SetMotionFunction(chrono_types::make_shared<ChFunction_Ramp>(0,this->speed));
        actuator->SetMotionOffset( this->h);
    */
    actuator = chrono_types::make_shared<ChLinkMotorLinearSpeed>();
    mysystem->Add(actuator);
    actuator->Initialize(nodeA, ground, false, ChFrame<>(outlet), ChFrame<>(outlet));
    actuator->SetSpeedFunction(chrono_types::make_shared<ChFunction_Const>(this->speed));
    actuator->SetMotionOffset(this->h);
}